

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MppBufferGroupImpl * mpp_buffer_get_misc_group(MppBufferMode mode,MppBufferType type)

{
  MppBufferType MVar1;
  RK_U32 id_00;
  int iVar2;
  int iVar3;
  Mutex *mutex;
  MppBufferService *pMVar4;
  char *local_90;
  char *local_78;
  char local_58 [4];
  RK_S32 offset;
  char tag [32];
  AutoMutex auto_lock;
  MppBufferType buf_type;
  RK_U32 id;
  MppBufferGroupImpl *misc;
  MppBufferType type_local;
  MppBufferMode mode_local;
  
  MVar1 = type & 0xffff;
  if (MVar1 == MPP_BUFFER_TYPE_NORMAL) {
    _type_local = (MppBufferGroupImpl *)0x0;
  }
  else {
    if ((1 < (int)mode) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "mode < MPP_BUFFER_MODE_BUTT","mpp_buffer_get_misc_group",0x361),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((MPP_BUFFER_TYPE_DMA_HEAP < MVar1) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "buf_type < MPP_BUFFER_TYPE_BUTT","mpp_buffer_get_misc_group",0x362),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    mutex = MppBufferService::get_lock();
    Mutex::Autolock::Autolock((Autolock *)(tag + 0x18),mutex,1);
    pMVar4 = MppBufferService::get_instance();
    id_00 = MppBufferService::get_misc(pMVar4,mode,type);
    if (id_00 == 0) {
      iVar2 = snprintf(local_58,0x20,"misc");
      if (MVar1 == MPP_BUFFER_TYPE_ION) {
        local_78 = "ion";
      }
      else {
        local_78 = "na";
        if (MVar1 == MPP_BUFFER_TYPE_DRM) {
          local_78 = "drm";
        }
      }
      iVar3 = snprintf(local_58 + iVar2,0x20 - (long)iVar2,"_%s",local_78);
      if (mode == MPP_BUFFER_INTERNAL) {
        local_90 = "enable_order_hint";
      }
      else {
        local_90 = "parser_subsps_ext";
      }
      local_90 = local_90 + 0xe;
      snprintf(local_58 + (iVar3 + iVar2),0x20 - (long)(iVar3 + iVar2),"_%s",local_90);
      pMVar4 = MppBufferService::get_instance();
      _buf_type = MppBufferService::get_group
                            (pMVar4,local_58,"mpp_buffer_get_misc_group",mode,type,1);
    }
    else {
      pMVar4 = MppBufferService::get_instance();
      _buf_type = MppBufferService::get_group_by_id(pMVar4,id_00);
    }
    _type_local = _buf_type;
    Mutex::Autolock::~Autolock((Autolock *)(tag + 0x18));
  }
  return _type_local;
}

Assistant:

MppBufferGroupImpl *mpp_buffer_get_misc_group(MppBufferMode mode, MppBufferType type)
{
    MppBufferGroupImpl *misc;
    RK_U32 id;
    MppBufferType buf_type;

    buf_type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    if (buf_type == MPP_BUFFER_TYPE_NORMAL)
        return NULL;

    mpp_assert(mode < MPP_BUFFER_MODE_BUTT);
    mpp_assert(buf_type < MPP_BUFFER_TYPE_BUTT);

    AutoMutex auto_lock(MppBufferService::get_lock());

    id = MppBufferService::get_instance()->get_misc(mode, type);
    if (!id) {
        char tag[32];
        RK_S32 offset = 0;

        offset += snprintf(tag + offset, sizeof(tag) - offset, "misc");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           buf_type == MPP_BUFFER_TYPE_ION ? "ion" :
                           buf_type == MPP_BUFFER_TYPE_DRM ? "drm" : "na");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           mode == MPP_BUFFER_INTERNAL ? "int" : "ext");

        misc = MppBufferService::get_instance()->get_group(tag, __FUNCTION__, mode, type, 1);
    } else
        misc = MppBufferService::get_instance()->get_group_by_id(id);

    return misc;
}